

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

double RigidBodyDynamics::Utils::CalcPotentialEnergy
                 (Model *model,VectorNd *q,bool update_kinematics)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  uint uVar1;
  byte in_DL;
  double *in_RSI;
  ReturnType RVar2;
  Vector3d g;
  Vector3d com;
  double mass;
  undefined1 in_stack_00000487;
  Vector3d *in_stack_00000488;
  Vector3d *in_stack_00000490;
  double *in_stack_00000498;
  VectorNd *in_stack_000004a0;
  VectorNd *in_stack_000004a8;
  Model *in_stack_000004b0;
  Vector3d *in_stack_000004c0;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffef8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Index in_stack_ffffffffffffff08;
  double *v1;
  double *v0;
  Vector3_t *in_stack_ffffffffffffff50;
  double local_48 [2];
  double local_38 [3];
  double local_20;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  v0 = local_38;
  local_10 = in_RSI;
  Vector3_t::Vector3_t((Vector3_t *)0x131744);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_ffffffffffffff08);
  v1 = local_48;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  uVar1 = local_11 & 1;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x0;
  CalcCenterOfMass(in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498,
                   in_stack_00000490,in_stack_00000488,in_stack_000004c0,(bool)in_stack_00000487);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1317d9);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             CONCAT44(in_stack_ffffffffffffff04,uVar1),(Index)other);
  this = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                    CONCAT44(in_stack_ffffffffffffff04,uVar1),(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             CONCAT44(in_stack_ffffffffffffff04,uVar1),(Index)other);
  Vector3_t::Vector3_t(in_stack_ffffffffffffff50,v0,v1,local_10);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-(this);
  Vector3_t::
  Vector3_t<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Vector3_t *)CONCAT44(in_stack_ffffffffffffff04,uVar1),
             (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)other);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     CONCAT44(in_stack_ffffffffffffff04,uVar1),other);
  return local_20 * RVar2;
}

Assistant:

RBDL_DLLAPI double CalcPotentialEnergy (Model &model, const Math::VectorNd &q, bool update_kinematics) {
	double mass;
	Vector3d com;
	CalcCenterOfMass (model, q, VectorNd::Zero (model.qdot_size), mass, com, NULL, NULL, update_kinematics);

	Vector3d g = - Vector3d (model.gravity[0], model.gravity[1], model.gravity[2]);
	LOG << "pot_energy: " << " mass = " << mass << " com = " << com.transpose() << std::endl;

	return mass * com.dot(g);
}